

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

bool QFontDatabase::isBitmapScalable(QString *family,QString *style)

{
  QtFontFoundry *pQVar1;
  char16_t *pcVar2;
  long lVar3;
  QtFontStyle **ppQVar4;
  QtFontStyle *pQVar5;
  uint3 uVar6;
  undefined3 uVar7;
  char cVar8;
  int iVar9;
  Type *pTVar10;
  QtFontFamily *pQVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  uint uVar15;
  long in_FS_OFFSET;
  QDeadlineTimer QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QString local_78;
  QString local_58;
  Key local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  parseFontName(family,&local_78,&local_58);
  pTVar10 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                        *)family);
  if (pTVar10 != (Type *)0x0) {
    QVar16.t2 = 0xffffffff;
    QVar16.type = 0x7fffffff;
    QVar16.t1 = (qint64)pTVar10;
    QRecursiveMutex::tryLock(QVar16);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  pQVar11 = QFontDatabasePrivate::family
                      (&QFontDatabasePrivate::instance::instance,&local_58,EnsurePopulated);
  if (pQVar11 != (QtFontFamily *)0x0) {
    local_3c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(&local_3c,style);
    if (0 < pQVar11->count) {
      lVar12 = 0;
      do {
        pQVar1 = pQVar11->foundries[lVar12];
        if (((local_78.d.size == 0) ||
            (iVar9 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_78), iVar9 == 0)) &&
           (iVar9 = pQVar1->count, 0 < (long)iVar9)) {
          pcVar2 = (style->d).ptr;
          lVar3 = (style->d).size;
          uVar7 = local_3c._0_3_;
          uVar15 = (uint)local_3c & 0xffffff;
          ppQVar4 = pQVar1->styles;
          lVar14 = 0;
          do {
            pQVar5 = ppQVar4[lVar14];
            if ((lVar3 == 0) ||
               (((pQVar5->styleName).d.size == lVar3 &&
                (QVar17.m_data = (pQVar5->styleName).d.ptr, QVar17.m_size = lVar3,
                QVar18.m_data = pcVar2, QVar18.m_size = lVar3,
                cVar8 = QtPrivate::equalStrings(QVar17,QVar18), cVar8 != '\0')))) {
LAB_0025b5e6:
              if (((*(uint *)&pQVar5->field_0x4 & 2) == 0 & (byte)*(uint *)&pQVar5->field_0x4) != 0)
              {
                bVar13 = true;
                goto LAB_0025b625;
              }
            }
            else {
              uVar6 = uVar7 ^ *(uint3 *)&pQVar5->key;
              if (((uVar6 & 0xfff) == 0) &&
                 ((*(uint3 *)&pQVar5->key < 0x1000 || uVar15 < 0x1000) || uVar6 < 0x1000))
              goto LAB_0025b5e6;
            }
            lVar14 = lVar14 + 1;
          } while (iVar9 != lVar14);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pQVar11->count);
      bVar13 = false;
      goto LAB_0025b625;
    }
  }
  bVar13 = false;
LAB_0025b625:
  if (pTVar10 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar13;
}

Assistant:

bool QFontDatabase::isBitmapScalable(const QString &family,
                                      const QString &style)
{
    bool bitmapScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFamily *f = d->family(familyName);
    if (!f) return bitmapScalable;

    QtFontStyle::Key styleKey(style);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                if ((style.isEmpty() ||
                     foundry->styles[k]->styleName == style ||
                     foundry->styles[k]->key == styleKey)
                    && foundry->styles[k]->bitmapScalable && !foundry->styles[k]->smoothScalable) {
                    bitmapScalable = true;
                    goto end;
                }
        }
    }
 end:
    return bitmapScalable;
}